

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharmmTorsionType.cpp
# Opt level: O0

void __thiscall
OpenMD::CharmmTorsionType::calcForce
          (CharmmTorsionType *this,RealType cosPhi,RealType *V,RealType *dVdCosPhi)

{
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  Polynomial<double> *in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  RealType sinPhi;
  undefined8 local_28;
  
  if ((double)in_XMM0_Qa <= 1.0) {
    if ((double)in_XMM0_Qa < -1.0) {
      in_XMM0_Qa = (Polynomial<double> *)0xbff0000000000000;
    }
  }
  else {
    in_XMM0_Qa = (Polynomial<double> *)0x3ff0000000000000;
  }
  local_28 = sqrt(-(double)in_XMM0_Qa * (double)in_XMM0_Qa + 1.0);
  if (ABS(local_28) < 1e-06) {
    local_28 = (double)((ulong)local_28 & 0x8000000000000000 | 0x3eb0c6f7a0b5ed8d);
  }
  dVar3 = *(double *)(in_RDI + 0x68);
  dVar1 = Polynomial<double>::evaluate(in_XMM0_Qa,in_RSI);
  dVar2 = Polynomial<double>::evaluate(in_XMM0_Qa,in_RSI);
  *in_RSI = dVar2 * local_28 + dVar3 + dVar1;
  dVar3 = Polynomial<double>::evaluateDerivative(in_XMM0_Qa,in_RSI);
  *in_RDX = dVar3;
  dVar3 = Polynomial<double>::evaluateDerivative(in_XMM0_Qa,in_RSI);
  *in_RDX = dVar3 * local_28 + *in_RDX;
  dVar3 = Polynomial<double>::evaluate(in_XMM0_Qa,in_RSI);
  *in_RDX = dVar3 / (local_28 * 2.0) + *in_RDX;
  return;
}

Assistant:

void CharmmTorsionType::calcForce(RealType cosPhi, RealType& V,
                                    RealType& dVdCosPhi) {
    // check roundoff
    if (cosPhi > 1.0) {
      cosPhi = 1.0;
    } else if (cosPhi < -1.0) {
      cosPhi = -1.0;
    }

    RealType sinPhi = sqrt(1.0 - cosPhi * cosPhi);

    // trick to avoid divergence in angles near 0 and pi:

    if (fabs(sinPhi) < 1.0E-6) { sinPhi = copysign(1.0E-6, sinPhi); }

    V         = C_ + T_.evaluate(cosPhi) + U_.evaluate(cosPhi) * sinPhi;
    dVdCosPhi = T_.evaluateDerivative(cosPhi);
    // Chain rule for U * sinPhi term:
    dVdCosPhi += U_.evaluateDerivative(cosPhi) * sinPhi;
    dVdCosPhi += U_.evaluate(cosPhi) / (2.0 * sinPhi);
  }